

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::ParseTwoCharToken(State *state,char *two_char_token)

{
  char *two_char_token_local;
  State *state_local;
  
  if ((*state->mangled_cur == *two_char_token) && (state->mangled_cur[1] == two_char_token[1])) {
    state->mangled_cur = state->mangled_cur + 2;
    state_local._7_1_ = true;
  }
  else {
    state_local._7_1_ = false;
  }
  return state_local._7_1_;
}

Assistant:

static bool ParseTwoCharToken(State *state, const char *two_char_token) {
  if (state->mangled_cur[0] == two_char_token[0] &&
      state->mangled_cur[1] == two_char_token[1]) {
    state->mangled_cur += 2;
    return true;
  }
  return false;
}